

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum64.c
# Opt level: O1

_Bool Hacl_Bignum64_mod(uint32_t len,uint64_t *n,uint64_t *a,uint64_t *res)

{
  size_t sVar1;
  uint64_t b;
  long lVar2;
  uint64_t *a_00;
  uint64_t *res_00;
  uint32_t len_00;
  uint64_t *n_00;
  uint64_t uVar3;
  uint32_t nBits;
  byte bVar4;
  void *__s;
  ulong uVar5;
  ulong uVar6;
  uint64_t *res_01;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  uint64_t uStack_90;
  uint64_t uStack_88;
  void *local_80;
  uint64_t *local_78;
  ulong local_70;
  ulong local_68;
  size_t local_60;
  undefined1 *local_58;
  uint64_t local_50;
  uint64_t *local_48;
  uint32_t local_3c;
  uint64_t *local_38;
  
  local_58 = (undefined1 *)&uStack_88;
  local_68 = (ulong)len;
  local_70 = local_68 * 8 + 0xf & 0xfffffffffffffff0;
  lVar2 = -local_70;
  __s = (void *)((long)&uStack_88 + lVar2);
  lVar7 = -local_70;
  sVar1 = local_68 * 8;
  nBits = 0;
  local_78 = a;
  local_48 = res;
  local_38 = n;
  *(undefined8 *)((long)&uStack_90 + lVar2) = 0x19a9f6;
  memset(__s,0,sVar1);
  local_80 = __s;
  local_60 = sVar1;
  *(undefined8 *)((long)&uStack_90 + lVar2) = 0x19aa0b;
  memset(__s,0,sVar1);
  *(undefined8 *)(local_58 + lVar7) = 1;
  local_50 = *local_38;
  local_3c = len;
  if (len == 0) {
    bVar9 = false;
  }
  else {
    uVar5 = 0;
    uVar8 = 0;
    do {
      uVar3 = *(uint64_t *)((long)local_80 + uVar5 * 8);
      b = local_38[uVar5];
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0x19aa4a;
      local_58 = (undefined1 *)FStar_UInt64_eq_mask(uVar3,b);
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0x19aa59;
      uVar3 = FStar_UInt64_gte_mask(uVar3,b);
      uVar8 = ~(uVar3 | (ulong)local_58) | uVar8 & (ulong)local_58;
      uVar5 = uVar5 + 1;
    } while (local_68 != uVar5);
    bVar9 = uVar8 == 0xffffffffffffffff;
  }
  uVar5 = local_68;
  if (local_3c != 0) {
    uVar6 = 0;
    uVar8 = 0;
    do {
      uVar3 = local_38[uVar6];
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0x19aaa8;
      uVar3 = FStar_UInt64_eq_mask(uVar3,0);
      uVar8 = (uVar8 ^ uVar6) & uVar3 ^ uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
    nBits = (int)uVar8 << 6;
  }
  n_00 = local_38;
  res_00 = local_48;
  sVar1 = local_60;
  bVar4 = (byte)local_50 & bVar9;
  uVar3 = CONCAT71((int7)(local_50 >> 8),bVar4);
  if (bVar4 == 0) {
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0x19ab41;
    memset(res_00,0,sVar1);
  }
  else {
    res_01 = (uint64_t *)((long)__s - local_70);
    local_50 = uVar3;
    local_38 = (uint64_t *)__s;
    res_01[-1] = 0x19aaf1;
    memset(res_01,0,sVar1);
    len_00 = local_3c;
    res_01[-1] = 0x19ab08;
    Hacl_Bignum_Montgomery_bn_precomp_r2_mod_n_u64(len_00,nBits,n_00,res_01);
    uVar3 = *n_00;
    res_01[-1] = 0x19ab11;
    uVar3 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(uVar3);
    a_00 = local_78;
    res_01[-1] = 0x19ab29;
    bn_slow_precomp(len_00,n_00,uVar3,res_01,a_00,res_00);
    uVar3 = local_50;
  }
  return (_Bool)((byte)uVar3 & 1);
}

Assistant:

bool Hacl_Bignum64_mod(uint32_t len, uint64_t *n, uint64_t *a, uint64_t *res)
{
  KRML_CHECK_SIZE(sizeof (uint64_t), len);
  uint64_t one[len];
  memset(one, 0U, len * sizeof (uint64_t));
  memset(one, 0U, len * sizeof (uint64_t));
  one[0U] = 1ULL;
  uint64_t bit0 = n[0U] & 1ULL;
  uint64_t m0 = 0ULL - bit0;
  uint64_t acc = 0ULL;
  for (uint32_t i = 0U; i < len; i++)
  {
    uint64_t beq = FStar_UInt64_eq_mask(one[i], n[i]);
    uint64_t blt = ~FStar_UInt64_gte_mask(one[i], n[i]);
    acc = (beq & acc) | (~beq & ((blt & 0xFFFFFFFFFFFFFFFFULL) | (~blt & 0ULL)));
  }
  uint64_t m1 = acc;
  uint64_t is_valid_m = m0 & m1;
  uint32_t nBits = 64U * (uint32_t)Hacl_Bignum_Lib_bn_get_top_index_u64(len, n);
  if (is_valid_m == 0xFFFFFFFFFFFFFFFFULL)
  {
    KRML_CHECK_SIZE(sizeof (uint64_t), len);
    uint64_t r2[len];
    memset(r2, 0U, len * sizeof (uint64_t));
    Hacl_Bignum_Montgomery_bn_precomp_r2_mod_n_u64(len, nBits, n, r2);
    uint64_t mu = Hacl_Bignum_ModInvLimb_mod_inv_uint64(n[0U]);
    bn_slow_precomp(len, n, mu, r2, a, res);
  }
  else
  {
    memset(res, 0U, len * sizeof (uint64_t));
  }
  return is_valid_m == 0xFFFFFFFFFFFFFFFFULL;
}